

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  size_t local_98;
  size_t i;
  size_t expressionCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_c482ce9e gcFrame;
  sysbvm_astSequenceNode_t **sequenceNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrameRecord.roots = (sysbvm_tuple_t *)0x0;
  gcFrame.expression = 0x2f;
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  expressionCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  sVar1 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
  for (local_98 = 0; local_98 < sVar1; local_98 = local_98 + 1) {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),local_98);
    gcFrame.expression =
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,(sysbvm_tuple_t)gcFrameRecord.roots,arguments[1]);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.expression;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astSequenceNode_t **sequenceNode = (sysbvm_astSequenceNode_t**)node;

    struct {
        sysbvm_tuple_t expression;
        sysbvm_tuple_t result;
    } gcFrame = {
        .result = SYSBVM_VOID_TUPLE,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sequenceNode)->super.sourcePosition);

    size_t expressionCount = sysbvm_array_getSize((*sequenceNode)->expressions);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at((*sequenceNode)->expressions, i);
        gcFrame.result = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.expression, *environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    return gcFrame.result;
}